

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::LoadRevisions(cmCTestSVN *this)

{
  bool bVar1;
  reference svninfo_00;
  SVNInfo *svninfo;
  iterator itend;
  iterator itbeg;
  cmCTestSVN *this_local;
  
  itend = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::begin
                    (&this->Repositories);
  svninfo = (SVNInfo *)
            std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::end
                      (&this->Repositories);
  while( true ) {
    bVar1 = std::operator!=(&itend,(_Self *)&svninfo);
    if (!bVar1) break;
    svninfo_00 = std::_List_iterator<cmCTestSVN::SVNInfo>::operator*(&itend);
    LoadRevisions(this,svninfo_00);
    std::_List_iterator<cmCTestSVN::SVNInfo>::operator++(&itend,0);
  }
  return;
}

Assistant:

void cmCTestSVN::LoadRevisions()
{
  // Get revisions for all the external repositories
  std::list<SVNInfo>::iterator itbeg = this->Repositories.begin();
  std::list<SVNInfo>::iterator itend = this->Repositories.end();
  for( ; itbeg != itend ; itbeg++)
    {
    SVNInfo& svninfo = *itbeg;
    LoadRevisions(svninfo);
    }
}